

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall gimage::Histogram::visualize(Histogram *this,ImageU8 *image,unsigned_long maxval)

{
  ulong in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  int *in_RDI;
  int k_1;
  int i_1;
  int i;
  int k;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  if (in_RDI[1] < 2) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)this,(long)image,maxval,
               _i);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_RSI);
    for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
      local_28 = 0xff - (int)((ulong)(*(long *)(*(long *)(in_RDI + 4) + (long)local_24 * 8) * 0xff)
                             / in_RDX);
      while (-1 < local_28) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (in_RSI,(long)local_24,(long)local_28,0,0xff);
        local_28 = local_28 + -1;
      }
    }
  }
  else {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)this,(long)image,maxval,
               _i);
    for (local_1c = 0; local_1c < in_RDI[1]; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (in_RSI,(long)local_20,(long)local_1c,0,
                   0xff - (char)((ulong)(*(long *)(*(long *)(*(long *)(in_RDI + 6) +
                                                            (long)local_1c * 8) + (long)local_20 * 8
                                                  ) * 0xff) / in_RDX));
      }
    }
  }
  return;
}

Assistant:

void Histogram::visualize(ImageU8 &image, unsigned long maxval) const
{
  if (h > 1)
  {
    image.setSize(w, h, 1);

    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, static_cast<unsigned char>(255-255*row[k][i]/maxval));
      }
    }
  }
  else
  {
    image.setSize(w, 256, 1);
    image.clear();

    for (int i=0; i<w; i++)
    {
      int k=255-255*val[i]/maxval;

      while (k >= 0)
      {
        image.set(i, k--, 0, 255);
      }
    }
  }
}